

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

u64 HighsHashHelpers::modexp_M61(u64 a,u64 e)

{
  ulong in_RSI;
  u64 in_RDI;
  u64 result;
  u64 in_stack_00000048;
  u64 in_stack_00000050;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RDI;
  for (local_10 = in_RSI; local_10 != 1; local_10 = local_10 >> 1) {
    local_18 = multiply_modM61(in_stack_00000050,in_stack_00000048);
    if ((local_10 & 1) != 0) {
      local_18 = multiply_modM61(in_stack_00000050,in_stack_00000048);
    }
  }
  return local_18;
}

Assistant:

static u64 modexp_M61(u64 a, u64 e) {
    // the exponent need to be greater than zero
    assert(e > 0);
    u64 result = a;

    while (e != 1) {
      // square
      result = multiply_modM61(result, result);

      // multiply with a if exponent is odd
      if (e & 1) result = multiply_modM61(result, a);

      // shift to next bit
      e = e >> 1;
    }

    return result;
  }